

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

int mbedtls_timing_self_test(int verbose)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  undefined1 local_84 [8];
  mbedtls_timing_delay_context ctx;
  uint32_t b;
  uint32_t a;
  mbedtls_timing_hr_time hires;
  int hardfail;
  unsigned_long secs;
  unsigned_long millisecs;
  unsigned_long ratio;
  unsigned_long cycles;
  int verbose_local;
  
  if (verbose != 0) {
    printf("  TIMING tests note: will take some time!\n");
    printf("  TIMING test #1 (set_alarm / get_timer): ");
  }
  for (stack0xffffffffffffffd0 = 1; stack0xffffffffffffffd0 < 4;
      register0x00000000 = stack0xffffffffffffffd0 + 1) {
    mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,1);
    mbedtls_set_alarm((int)stack0xffffffffffffffd0);
    do {
    } while (mbedtls_timing_alarmed == 0);
    uVar2 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&b,0);
    if ((uVar2 < stack0xffffffffffffffd0 * 800) || (stack0xffffffffffffffd0 * 0x4b0 + 300 < uVar2))
    {
      if (verbose != 0) {
        printf("failed\n");
      }
      return 1;
    }
  }
  if (verbose != 0) {
    printf("passed\n");
    printf("  TIMING test #2 (set/get_delay        ): ");
  }
  for (ctx.fin_ms = 200; ctx.fin_ms < 0x191; ctx.fin_ms = ctx.fin_ms + 200) {
    for (ctx.int_ms = 200; ctx.int_ms < 0x191; ctx.int_ms = ctx.int_ms + 200) {
      mbedtls_timing_set_delay(local_84,ctx.fin_ms,ctx.fin_ms + ctx.int_ms);
      busy_msleep((ulong)(ctx.fin_ms - (ctx.fin_ms >> 3)));
      iVar1 = mbedtls_timing_get_delay(local_84);
      if (iVar1 != 0) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      busy_msleep((ulong)(ctx.fin_ms >> 2));
      iVar1 = mbedtls_timing_get_delay(local_84);
      if (iVar1 != 1) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      busy_msleep((ulong)((ctx.int_ms - (ctx.fin_ms >> 3)) - (ctx.int_ms >> 3)));
      iVar1 = mbedtls_timing_get_delay(local_84);
      if (iVar1 != 1) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
      busy_msleep((ulong)(ctx.int_ms >> 2));
      iVar1 = mbedtls_timing_get_delay(local_84);
      if (iVar1 != 2) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
    }
  }
  mbedtls_timing_set_delay(local_84,0,0);
  busy_msleep(200);
  iVar1 = mbedtls_timing_get_delay(local_84);
  if (iVar1 == -1) {
    if (verbose != 0) {
      printf("passed\n");
      printf("  TIMING test #3 (hardclock / get_timer): ");
    }
    hires.opaque[0x18] = '\0';
    hires.opaque[0x19] = '\0';
    hires.opaque[0x1a] = '\0';
    hires.opaque[0x1b] = '\0';
    for (; (int)hires.opaque._24_4_ < 2; hires.opaque._24_4_ = hires.opaque._24_4_ + 1) {
      uVar2 = mbedtls_timing_hardclock();
      busy_msleep(1);
      uVar3 = mbedtls_timing_hardclock();
      uVar4 = (uVar3 - uVar2) / 1;
      secs = 2;
      while( true ) {
        if (4 < secs) {
          if (verbose != 0) {
            printf("passed\n");
          }
          goto LAB_0011d53a;
        }
        uVar2 = mbedtls_timing_hardclock();
        busy_msleep(secs);
        uVar3 = mbedtls_timing_hardclock();
        if (((uVar3 - uVar2) / secs < uVar4 - uVar4 / 5) ||
           (uVar4 + uVar4 / 5 < (uVar3 - uVar2) / secs)) break;
        secs = secs + 1;
      }
    }
    if (verbose != 0) {
      printf("failed (ignored)\n");
    }
LAB_0011d53a:
    if (verbose != 0) {
      printf(anon_var_dwarf_a2ec + 8);
    }
    cycles._4_4_ = 0;
  }
  else {
    if (verbose != 0) {
      printf("failed\n");
    }
    cycles._4_4_ = 1;
  }
  return cycles._4_4_;
}

Assistant:

int mbedtls_timing_self_test( int verbose )
{
    unsigned long cycles, ratio;
    unsigned long millisecs, secs;
    int hardfail;
    struct mbedtls_timing_hr_time hires;
    uint32_t a, b;
    mbedtls_timing_delay_context ctx;

    if( verbose != 0 )
        mbedtls_printf( "  TIMING tests note: will take some time!\n" );


    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #1 (set_alarm / get_timer): " );

    for( secs = 1; secs <= 3; secs++ )
    {
        (void) mbedtls_timing_get_timer( &hires, 1 );

        mbedtls_set_alarm( (int) secs );
        while( !mbedtls_timing_alarmed )
            ;

        millisecs = mbedtls_timing_get_timer( &hires, 0 );

        /* For some reason on Windows it looks like alarm has an extra delay
         * (maybe related to creating a new thread). Allow some room here. */
        if( millisecs < 800 * secs || millisecs > 1200 * secs + 300 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #2 (set/get_delay        ): " );

    for( a = 200; a <= 400; a += 200 )
    {
        for( b = 200; b <= 400; b += 200 )
        {
            mbedtls_timing_set_delay( &ctx, a, a + b );

            busy_msleep( a - a / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 0 )
                FAIL;

            busy_msleep( a / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b - a / 8 - b / 8 );
            if( mbedtls_timing_get_delay( &ctx ) != 1 )
                FAIL;

            busy_msleep( b / 4 );
            if( mbedtls_timing_get_delay( &ctx ) != 2 )
                FAIL;
        }
    }

    mbedtls_timing_set_delay( &ctx, 0, 0 );
    busy_msleep( 200 );
    if( mbedtls_timing_get_delay( &ctx ) != -1 )
        FAIL;

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #3 (hardclock / get_timer): " );

    /*
     * Allow one failure for possible counter wrapping.
     * On a 4Ghz 32-bit machine the cycle counter wraps about once per second;
     * since the whole test is about 10ms, it shouldn't happen twice in a row.
     */
    hardfail = 0;

hard_test:
    if( hardfail > 1 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed (ignored)\n" );

        goto hard_test_done;
    }

    /* Get a reference ratio cycles/ms */
    millisecs = 1;
    cycles = mbedtls_timing_hardclock();
    busy_msleep( millisecs );
    cycles = mbedtls_timing_hardclock() - cycles;
    ratio = cycles / millisecs;

    /* Check that the ratio is mostly constant */
    for( millisecs = 2; millisecs <= 4; millisecs++ )
    {
        cycles = mbedtls_timing_hardclock();
        busy_msleep( millisecs );
        cycles = mbedtls_timing_hardclock() - cycles;

        /* Allow variation up to 20% */
        if( cycles / millisecs < ratio - ratio / 5 ||
            cycles / millisecs > ratio + ratio / 5 )
        {
            hardfail++;
            goto hard_test;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

hard_test_done:

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}